

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void av1_cnn_activate_c(float **output,int channels,int width,int height,int stride,
                       ACTIVATION layer_activation)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  char in_R9B;
  float fVar1;
  int j_1;
  int i_1;
  int c_1;
  int j;
  int i;
  int c;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  
  if (in_R9B == '\x01') {
    for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
        for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
          fVar1 = relu(*(float *)(*(long *)(in_RDI + (long)local_20 * 8) +
                                 (long)(local_24 * in_R8D + local_28) * 4));
          *(float *)(*(long *)(in_RDI + (long)local_20 * 8) +
                    (long)(local_24 * in_R8D + local_28) * 4) = fVar1;
        }
      }
    }
  }
  else if (in_R9B == '\x02') {
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
        for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
          fVar1 = softsign(*(float *)(*(long *)(in_RDI + (long)local_2c * 8) +
                                     (long)(local_30 * in_R8D + local_34) * 4));
          *(float *)(*(long *)(in_RDI + (long)local_2c * 8) +
                    (long)(local_30 * in_R8D + local_34) * 4) = fVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_cnn_activate_c(float **output, int channels, int width, int height,
                        int stride, ACTIVATION layer_activation) {
  if (layer_activation == RELU) {
    for (int c = 0; c < channels; ++c) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          output[c][i * stride + j] = relu(output[c][i * stride + j]);
    }
  } else if (layer_activation == SOFTSIGN) {
    for (int c = 0; c < channels; ++c) {
      for (int i = 0; i < height; ++i)
        for (int j = 0; j < width; ++j)
          output[c][i * stride + j] = softsign(output[c][i * stride + j]);
    }
  } else if (layer_activation == SIGMOID) {
    assert(0 && "Sigmoid has not been supported in CNN.");  // TO DO
  } else if (layer_activation != NONE) {
    assert(0 && "Unknown activation type");
  }
}